

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SessionPropertiesThreads_Test::TestBody
          (SSLVersionTest_SessionPropertiesThreads_Test *this)

{
  uint16_t uVar1;
  uint16_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  internal iVar6;
  ulong uVar7;
  ssl_session_st *psVar8;
  ssl_session_st *psVar9;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX_02;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX_03;
  anon_class_16_2_b278af79_for__M_head_impl *__args;
  thread *thread;
  ulong uVar10;
  ssl_session_st *psVar11;
  _Head_base<0UL,_ssl_session_st_*,_false> _Var12;
  char *in_R9;
  char *pcVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *expected_predicate_value;
  ulong __n;
  pointer *__ptr;
  long lVar14;
  uint16_t *puVar15;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  UniquePtr<SSL> ssls [4];
  UniquePtr<SSL_SESSION> session;
  thread local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  undefined1 local_e8 [32];
  AssertHelper local_c8;
  Message local_c0;
  __uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> local_b8;
  _Head_base<0UL,_ssl_st_*,_false> _Stack_b0;
  __uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> local_a8;
  __uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> _Stack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  size_type sStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  ulong local_48 [2];
  _Head_base<0UL,_ssl_session_st_*,_false> local_38;
  
  bVar5 = SSLVersionTest::is_tls13(&this->super_SSLVersionTest);
  if (bVar5) {
    local_88._8_8_ = 0;
    local_88._24_8_ = 0;
    sStack_60 = 0;
    local_58._8_8_ = 0;
    local_98._0_8_ = (SSL_SESSION *)0x0;
    local_98._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
    local_88._16_8_ = 0;
    local_58._M_allocated_capacity = 0;
    local_48[0]._0_1_ = '\0';
    local_48[0]._1_1_ = '\0';
    local_48[0]._2_1_ = '\0';
    local_48[0]._3_1_ = '\0';
    local_48[0]._4_1_ = '\0';
    local_48[0]._5_1_ = '\0';
    local_48[0]._6_1_ = '\0';
    local_48[0]._7_1_ = '\0';
    local_88._0_8_ = local_88 + 0x10;
    local_68._M_p = (pointer)&local_58;
    CreateClientSession((anon_unknown_0 *)local_e8,
                        (this->super_SSLVersionTest).client_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (this->super_SSLVersionTest).server_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (ClientConfig *)local_98);
    uVar3 = local_e8._0_8_;
    _Stack_b0._M_head_impl = (ssl_st *)0x0;
    local_b8._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl._0_1_ =
         (internal)((ssl_session_st *)local_e8._0_8_ == (ssl_session_st *)0x0);
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if ((ssl_session_st *)uVar3 == (ssl_session_st *)0x0) {
      return;
    }
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&local_b8,
               (AssertionResult *)"CreateClientSession(client_ctx_.get(), server_ctx_.get())","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1a4d,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)local_e8);
LAB_001b2ff8:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((SSL_SESSION *)local_98._0_8_ != (SSL_SESSION *)local_88) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
    }
    if ((_Head_base<0UL,_ssl_session_st_*,_false>)local_e8._0_8_ !=
        (_Head_base<0UL,_ssl_session_st_*,_false>)0x0) {
      (**(code **)((native_handle_type)*(id *)local_e8._0_8_ + 8))();
    }
    if (_Stack_b0._M_head_impl != (ssl_st *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_b0._M_head_impl);
    }
    return;
  }
  SSL_CTX_set_options((this->super_SSLVersionTest).server_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,0x4000);
  SSL_CTX_set_session_cache_mode
            ((this->super_SSLVersionTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
  SSL_CTX_set_session_cache_mode
            ((this->super_SSLVersionTest).server_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
  iVar6 = (internal)
          SSLVersionTest::UseCertAndKey
                    (&this->super_SSLVersionTest,
                     (this->super_SSLVersionTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  _Stack_b0._M_head_impl = (ssl_st *)0x0;
  local_b8._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl._0_1_ = iVar6;
  if (!(bool)iVar6) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&local_b8,
               (AssertionResult *)"UseCertAndKey(client_ctx_.get())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1a55,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)local_e8);
    goto LAB_001b2ff8;
  }
  local_b8._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl._0_1_ =
       (internal)
       SSLVersionTest::UseCertAndKey
                 (&this->super_SSLVersionTest,
                  (this->super_SSLVersionTest).server_ctx_._M_t.
                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  _Stack_b0._M_head_impl = (ssl_st *)0x0;
  if (!(bool)local_b8._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl._0_1_) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&local_b8,
               (AssertionResult *)"UseCertAndKey(server_ctx_.get())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1a56,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)local_e8);
    goto LAB_001b2ff8;
  }
  SSL_CTX_set_custom_verify
            ((this->super_SSLVersionTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1,
             TestBody::anon_class_1_0_00000001::__invoke);
  SSL_CTX_set_custom_verify
            ((this->super_SSLVersionTest).server_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1,
             TestBody::anon_class_1_0_00000001::__invoke);
  local_88._0_8_ = local_88 + 0x10;
  local_88._8_8_ = 0;
  local_88._24_8_ = 0;
  sStack_60 = 0;
  local_58._8_8_ = 0;
  local_98._0_8_ = (SSL_SESSION *)0x0;
  local_98._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
  local_88._16_8_ = 0;
  local_58._M_allocated_capacity = 0;
  local_48[0] = 0;
  local_68._M_p = (pointer)&local_58;
  CreateClientSession((anon_unknown_0 *)&local_38,
                      (this->super_SSLVersionTest).client_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                      (this->super_SSLVersionTest).server_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                      (ClientConfig *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  expected_predicate_value = &local_58;
  local_b8._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl._0_1_ =
       (internal)(local_38._M_head_impl != (SSL_SESSION *)0x0);
  _Stack_b0._M_head_impl = (ssl_st *)0x0;
  if (local_38._M_head_impl == (SSL_SESSION *)0x0) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&local_b8,(AssertionResult *)0x34e814,"false","true",
               expected_predicate_value->_M_local_buf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1a63,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((SSL_SESSION *)local_98._0_8_ != (SSL_SESSION *)local_88) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
    }
    if ((ssl_session_st *)local_e8._0_8_ != (ssl_session_st *)0x0) {
      (**(code **)((native_handle_type)*(id *)local_e8._0_8_ + 8))();
    }
    if (_Stack_b0._M_head_impl != (ssl_st *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_b0._M_head_impl);
    }
    goto LAB_001b326a;
  }
  local_a8._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
       (tuple<ssl_st_*,_bssl::internal::Deleter>)
       (_Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)0x0;
  _Stack_a0._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
       (tuple<ssl_st_*,_bssl::internal::Deleter>)
       (_Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)0x0;
  local_b8._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
       (tuple<ssl_st_*,_bssl::internal::Deleter>)
       (_Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)0x0;
  _Stack_b0._M_head_impl = (ssl_st *)0x0;
  local_98._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
  local_88._0_8_ = local_88 + 0x10;
  local_88._8_8_ = 0;
  local_88._16_8_ = local_88._16_8_ & 0xffffffffffffff00;
  sStack_60 = 0;
  local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
  local_48[0] = local_48[0] & 0xffffff0000000000;
  local_98._0_8_ = local_38._M_head_impl;
  pcVar13 = (char *)0x1;
  local_68._M_p = (pointer)expected_predicate_value;
  local_f8._M_id._M_thread._0_1_ =
       (internal)
       ConnectClientAndServer
                 ((UniquePtr<SSL> *)&local_b8,(UniquePtr<SSL> *)&_Stack_b0,
                  (this->super_SSLVersionTest).client_ctx_._M_t.
                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                  (this->super_SSLVersionTest).server_ctx_._M_t.
                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,(ClientConfig *)local_98,
                  true);
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_f8._M_id._M_thread._0_1_) {
    pcVar13 = (char *)0x1;
    local_f8._M_id._M_thread._0_1_ =
         (internal)
         ConnectClientAndServer
                   ((UniquePtr<SSL> *)&local_a8,(UniquePtr<SSL> *)&_Stack_a0,
                    (this->super_SSLVersionTest).client_ctx_._M_t.
                    super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                    (this->super_SSLVersionTest).server_ctx_._M_t.
                    super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,(ClientConfig *)local_98
                    ,true);
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_f8._M_id._M_thread._0_1_) {
      testing::Message::Message(&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e8,(internal *)&local_f8,
                 (AssertionResult *)
                 "ConnectClientAndServer(&ssls[2], &ssls[3], client_ctx_.get(), server_ctx_.get(), config)"
                 ,"false","true",pcVar13);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1a6c,(char *)local_e8._0_8_);
      testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
      goto LAB_001b31b4;
    }
    local_e8._0_8_ = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
    local_e8._8_8_ = (ssl_session_st *)0x0;
    local_e8._16_8_ = (ssl_session_st *)0x0;
    lVar14 = 0;
    __args = extraout_RDX;
    do {
      uVar4 = local_e8._8_8_;
      uVar3 = local_e8._0_8_;
      local_f0 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)&local_b8._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + lVar14);
      if (local_e8._8_8_ == local_e8._16_8_) {
        if (local_e8._8_8_ - local_e8._0_8_ == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar10 = (long)(local_e8._8_8_ - local_e8._0_8_) >> 3;
        uVar7 = uVar10 + (uVar10 == 0);
        __n = uVar7 + uVar10;
        if (0xffffffffffffffe < __n) {
          __n = 0xfffffffffffffff;
        }
        if (CARRY8(uVar7,uVar10)) {
          __n = 0xfffffffffffffff;
        }
        if (__n == 0) {
          psVar8 = (ssl_session_st *)0x0;
        }
        else {
          psVar8 = (ssl_session_st *)
                   __gnu_cxx::new_allocator<std::thread>::allocate
                             ((new_allocator<std::thread> *)local_e8,__n,(void *)0x0);
          __args = extraout_RDX_01;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionPropertiesThreads_Test::TestBody()::__0>
                  ((allocator_type *)((psVar8->secret).storage_ + uVar10 * 8 + -10),&local_f8,__args
                  );
        psVar11 = psVar8;
        for (psVar9 = (ssl_session_st *)uVar3; psVar9 != (ssl_session_st *)uVar4;
            psVar9 = (ssl_session_st *)&psVar9->peer_signature_algorithm) {
          uVar1 = psVar9->ssl_version;
          uVar2 = psVar9->group_id;
          psVar11->super_RefCounted<ssl_session_st> =
               (RefCounted<ssl_session_st>)(psVar9->super_RefCounted<ssl_session_st>).references_;
          psVar11->ssl_version = uVar1;
          psVar11->group_id = uVar2;
          *(id *)psVar9 = (id)0x0;
          psVar11 = (ssl_session_st *)&psVar11->peer_signature_algorithm;
        }
        __args = extraout_RDX_02;
        if ((ssl_session_st *)uVar3 != (ssl_session_st *)0x0) {
          operator_delete((void *)uVar3,local_e8._16_8_ - uVar3);
          __args = extraout_RDX_03;
        }
        local_e8._16_8_ = (psVar8->secret).storage_ + __n * 8 + -10;
        local_e8._0_8_ = psVar8;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionPropertiesThreads_Test::TestBody()::__0>
                  ((allocator_type *)local_e8._8_8_,&local_f8,__args);
        __args = extraout_RDX_00;
        psVar11 = (ssl_session_st *)local_e8._8_8_;
      }
      puVar15 = &psVar11->peer_signature_algorithm;
      lVar14 = lVar14 + 8;
      _Var12._M_head_impl = (ssl_session_st *)local_e8._0_8_;
      local_e8._8_8_ = puVar15;
    } while (lVar14 != 0x20);
    for (; _Var12._M_head_impl != (ssl_session_st *)puVar15;
        _Var12._M_head_impl = _Var12._M_head_impl + 8) {
      std::thread::join();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_e8);
  }
  else {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)&local_f8,
               (AssertionResult *)
               "ConnectClientAndServer(&ssls[0], &ssls[1], client_ctx_.get(), server_ctx_.get(), config)"
               ,"false","true",pcVar13);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1a6a,(char *)local_e8._0_8_);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
LAB_001b31b4:
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((ssl_session_st *)local_e8._0_8_ != (ssl_session_st *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
    }
    if (local_c0.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_c0.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  lVar14 = 0x18;
  do {
    std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
               ((long)&local_b8._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + lVar14));
    lVar14 = lVar14 + -8;
  } while (lVar14 != -8);
LAB_001b326a:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_38);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SessionPropertiesThreads) {
  if (is_tls13()) {
    // Our TLS 1.3 implementation does not support stateful resumption.
    ASSERT_FALSE(CreateClientSession(client_ctx_.get(), server_ctx_.get()));
    return;
  }

  SSL_CTX_set_options(server_ctx_.get(), SSL_OP_NO_TICKET);
  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);

  ASSERT_TRUE(UseCertAndKey(client_ctx_.get()));
  ASSERT_TRUE(UseCertAndKey(server_ctx_.get()));

  // Configure mutual authentication, so we have more session state.
  SSL_CTX_set_custom_verify(
      client_ctx_.get(), SSL_VERIFY_PEER,
      [](SSL *ssl, uint8_t *out_alert) { return ssl_verify_ok; });
  SSL_CTX_set_custom_verify(
      server_ctx_.get(), SSL_VERIFY_PEER,
      [](SSL *ssl, uint8_t *out_alert) { return ssl_verify_ok; });

  // Establish a client session to test with.
  bssl::UniquePtr<SSL_SESSION> session =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session);

  // Resume with it twice.
  UniquePtr<SSL> ssls[4];
  ClientConfig config;
  config.session = session.get();
  ASSERT_TRUE(ConnectClientAndServer(&ssls[0], &ssls[1], client_ctx_.get(),
                                     server_ctx_.get(), config));
  ASSERT_TRUE(ConnectClientAndServer(&ssls[2], &ssls[3], client_ctx_.get(),
                                     server_ctx_.get(), config));

  // Read properties in parallel.
  auto read_properties = [](const SSL *ssl) {
    EXPECT_TRUE(SSL_get_peer_cert_chain(ssl));
    bssl::UniquePtr<X509> peer(SSL_get_peer_certificate(ssl));
    EXPECT_TRUE(peer);
    EXPECT_TRUE(SSL_get_current_cipher(ssl));
    EXPECT_TRUE(SSL_get_group_id(ssl));
  };

  std::vector<std::thread> threads;
  for (const auto &ssl_ptr : ssls) {
    const SSL *ssl = ssl_ptr.get();
    threads.emplace_back([=] { read_properties(ssl); });
  }
  for (auto &thread : threads) {
    thread.join();
  }
}